

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qelapsedtimer.cpp
# Opt level: O2

void __thiscall QElapsedTimer::start(QElapsedTimer *this)

{
  qint64 qVar1;
  
  qVar1 = std::chrono::_V2::steady_clock::now();
  this->t1 = qVar1;
  this->t2 = 0;
  return;
}

Assistant:

void QElapsedTimer::start() noexcept
{
    static_assert(sizeof(t1) == sizeof(Duration::rep));

    // This assignment will work so long as TimePoint uses the same time
    // duration or one of finer granularity than steady_clock::time_point. That
    // means it will work until the first steady_clock using picoseconds.
    TimePoint now = std::chrono::steady_clock::now();
    t1 = now.time_since_epoch().count();
    QT6_ONLY(t2 = 0);
}